

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O0

EmitExpressionInfo __thiscall
Js::AsmJSByteCodeGenerator::EmitBinaryInt
          (AsmJSByteCodeGenerator *this,ParseNode *pnode,OpCodeAsmJs op)

{
  ParseNode *pnode_00;
  bool bVar1;
  RegSlot R0;
  ParseNodeInt *pPVar2;
  AsmJsCompilationException *pAVar3;
  bool local_99;
  bool local_8d;
  AsmJsType local_88;
  RegSlot dstReg;
  AsmJsType *local_80;
  AsmJsType *rType;
  AsmJsType *lType;
  EmitExpressionInfo *local_68;
  EmitExpressionInfo *rhsEmit;
  EmitExpressionInfo *local_58;
  EmitExpressionInfo *lhsEmit;
  AsmJsRetType local_40;
  bool local_3a;
  bool local_39;
  bool isOr0Operation;
  ParseNode *pPStack_38;
  bool isRhs0;
  ParseNode *rhs;
  ParseNode *lhs;
  ParseNode *pPStack_20;
  OpCodeAsmJs op_local;
  ParseNode *pnode_local;
  AsmJSByteCodeGenerator *this_local;
  EmitExpressionInfo emitInfo;
  
  lhs._6_2_ = op;
  pPStack_20 = pnode;
  pnode_local = (ParseNode *)this;
  rhs = ParserWrapper::GetBinaryLeft(pnode);
  pPStack_38 = ParserWrapper::GetBinaryRight(pPStack_20);
  local_8d = false;
  if (pPStack_38->nop == knopInt) {
    pPVar2 = ParseNode::AsParseNodeInt(pPStack_38);
    local_8d = pPVar2->lw == 0;
  }
  pnode_00 = rhs;
  local_39 = local_8d;
  local_99 = false;
  if (lhs._6_2_ == Or_Int) {
    local_99 = local_8d;
  }
  local_3a = local_99;
  if ((local_99 == false) || (rhs->nop != knopCall)) {
    rhsEmit = (EmitExpressionInfo *)Emit(this,rhs);
    local_58 = (EmitExpressionInfo *)&rhsEmit;
    lType = (AsmJsType *)Emit(this,pPStack_38);
    local_68 = (EmitExpressionInfo *)&lType;
    rType = &local_58->type;
    local_80 = (AsmJsType *)((long)&lType + 4);
    bVar1 = AsmJsType::isIntish(rType);
    if ((!bVar1) || (bVar1 = AsmJsType::isIntish(local_80), !bVar1)) {
      pAVar3 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
      AsmJsCompilationException::AsmJsCompilationException
                (pAVar3,
                 L"Invalid type for [| & ^ >> << >>>] left and right operand must be of type intish"
                );
      __cxa_throw(pAVar3,&AsmJsCompilationException::typeinfo,0);
    }
    bVar1 = AsmJsFunc::IsValidLocation<int>(this->mFunction,local_58);
    if (!bVar1) {
      pAVar3 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
      AsmJsCompilationException::AsmJsCompilationException
                (pAVar3,L"Invalid Node location[%d] ",(ulong)(local_58->super_EmitInfoBase).location
                );
      __cxa_throw(pAVar3,&AsmJsCompilationException::typeinfo,0);
    }
    bVar1 = AsmJsFunc::IsValidLocation<int>(this->mFunction,local_68);
    if (!bVar1) {
      pAVar3 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
      AsmJsCompilationException::AsmJsCompilationException
                (pAVar3,L"Invalid Node location[%d] ",(ulong)(local_68->super_EmitInfoBase).location
                );
      __cxa_throw(pAVar3,&AsmJsCompilationException::typeinfo,0);
    }
    StartStatement(this,pPStack_20);
    AsmJsType::AsmJsType((AsmJsType *)&dstReg,Signed);
    EmitExpressionInfo::EmitExpressionInfo((EmitExpressionInfo *)&this_local,(AsmJsType *)&dstReg);
    if (lhs._6_2_ == Shr_UInt) {
      AsmJsType::AsmJsType(&local_88,Unsigned);
      this_local = (AsmJSByteCodeGenerator *)CONCAT44(local_88.which_,this_local._0_4_);
    }
    if (((local_39 & 1U) == 0) || (lhs._6_2_ == And_Int)) {
      R0 = GetAndReleaseBinaryLocations<int>(this,local_58,local_68);
      AsmJsByteCodeWriter::AsmReg3
                (&this->mWriter,lhs._6_2_,R0,(local_58->super_EmitInfoBase).location,
                 (local_68->super_EmitInfoBase).location);
      this_local = (AsmJSByteCodeGenerator *)CONCAT44(this_local._4_4_,R0);
    }
    else {
      AsmJsFunc::ReleaseLocation<int>(this->mFunction,local_68);
      this_local = (AsmJSByteCodeGenerator *)
                   CONCAT44(this_local._4_4_,(local_58->super_EmitInfoBase).location);
    }
    EndStatement(this,pPStack_20);
  }
  else {
    AsmJsRetType::AsmJsRetType(&local_40,Signed);
    this_local = (AsmJSByteCodeGenerator *)EmitCall(this,pnode_00,local_40);
    bVar1 = AsmJsType::isIntish((AsmJsType *)((long)&this_local + 4));
    if (!bVar1) {
      pAVar3 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
      AsmJsCompilationException::AsmJsCompilationException
                (pAVar3,
                 L"Invalid type for [| & ^ >> << >>>] left and right operand must be of type intish"
                );
      __cxa_throw(pAVar3,&AsmJsCompilationException::typeinfo,0);
    }
    AsmJsType::AsmJsType((AsmJsType *)&lhsEmit,Signed);
    this_local = (AsmJSByteCodeGenerator *)CONCAT44(lhsEmit._0_4_,this_local._0_4_);
  }
  return (EmitExpressionInfo)this_local;
}

Assistant:

EmitExpressionInfo AsmJSByteCodeGenerator::EmitBinaryInt( ParseNode * pnode, OpCodeAsmJs op )
    {
        ParseNode* lhs = ParserWrapper::GetBinaryLeft( pnode );
        ParseNode* rhs = ParserWrapper::GetBinaryRight( pnode );
        const bool isRhs0 = rhs->nop == knopInt && rhs->AsParseNodeInt()->lw == 0;
        const bool isOr0Operation = op == OpCodeAsmJs::Or_Int && isRhs0;
        if( isOr0Operation && lhs->nop == knopCall )
        {
            EmitExpressionInfo info = EmitCall(lhs, AsmJsRetType::Signed);
            if (!info.type.isIntish())
            {
                throw AsmJsCompilationException(_u("Invalid type for [| & ^ >> << >>>] left and right operand must be of type intish"));
            }
            info.type = AsmJsType::Signed;
            return info;
        }
        const EmitExpressionInfo& lhsEmit = Emit( lhs );
        const EmitExpressionInfo& rhsEmit = Emit( rhs );
        const AsmJsType& lType = lhsEmit.type;
        const AsmJsType& rType = rhsEmit.type;
        if( !lType.isIntish() || !rType.isIntish() )
        {
            throw AsmJsCompilationException( _u("Invalid type for [| & ^ >> << >>>] left and right operand must be of type intish") );
        }
        CheckNodeLocation( lhsEmit, int );
        CheckNodeLocation( rhsEmit, int );
        StartStatement(pnode);
        EmitExpressionInfo emitInfo( AsmJsType::Signed );
        if( op == OpCodeAsmJs::Shr_UInt )
        {
            emitInfo.type = AsmJsType::Unsigned;
        }
        // ignore this specific operation, useful for non asm.js
        if( !isRhs0 || op == OpCodeAsmJs::And_Int )
        {
            RegSlot dstReg = GetAndReleaseBinaryLocations<int>( &lhsEmit, &rhsEmit );
            mWriter.AsmReg3( op, dstReg, lhsEmit.location, rhsEmit.location );
            emitInfo.location = dstReg;
        }
        else
        {
            mFunction->ReleaseLocation<int>( &rhsEmit );
            emitInfo.location = lhsEmit.location;
        }
        EndStatement(pnode);
        return emitInfo;
    }